

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::write
          (PromisedAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long *plVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  PromiseArena *pPVar5;
  undefined1 local_60 [32];
  Event *local_40;
  Event **local_38;
  
  pPVar5 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  plVar1 = *(long **)(pPVar5->bytes + 0x20);
  if (plVar1 == (long *)0x0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_60);
    uVar3 = local_60._0_8_;
    pPVar2 = ((PromiseArenaMember *)local_60._0_8_)->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_60._0_8_ - (long)pPVar2) < 0x38) {
      pvVar4 = operator_new(0x400);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8),(OwnPromiseNode *)local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2521:39)>
                 ::anon_class_24_2_4df0a340_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3c8) = &PTR_destroy_006e06d0;
      *(PromiseArena **)((long)pvVar4 + 1000) = pPVar5;
      *(void **)((long)pvVar4 + 0x3f0) = __buf;
      *(size_t *)((long)pvVar4 + 0x3f8) = __n;
      *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
      local_60._16_8_ = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8);
    }
    else {
      ((PromiseArenaMember *)local_60._0_8_)->arena = (PromiseArena *)0x0;
      local_60._8_8_ = &((PromiseArenaMember *)(local_60._0_8_ + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_60._8_8_,(OwnPromiseNode *)local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2521:39)>
                 ::anon_class_24_2_4df0a340_for_func::operator());
      ((PromiseArenaMember *)(uVar3 + -0x40))->arena = (PromiseArena *)&PTR_destroy_006e06d0;
      ((PromiseArenaMember *)(uVar3 + -0x20))->arena = pPVar5;
      ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)__buf;
      ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)__n;
      ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
      local_60._16_8_ = local_60._8_8_;
    }
    local_60._24_8_ = &DAT_004ddfe0;
    local_40 = (Event *)&DAT_004de03f;
    local_38 = (Event **)0x4c0000058b;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)(local_60 + 0x10),
               (SourceLocation *)(local_60 + 0x18));
    uVar3 = local_60._16_8_;
    if ((TransformPromiseNodeBase *)local_60._16_8_ != (TransformPromiseNodeBase *)0x0) {
      local_60._16_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
    uVar3 = local_60._0_8_;
    if ((PromiseArenaMember *)local_60._0_8_ != (PromiseArenaMember *)0x0) {
      local_60._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
  }
  else {
    (**(code **)(*plVar1 + 8))(this,plVar1,__buf,__n);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->write(pieces);
    }